

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase32::~TestCase32(TestCase32 *this)

{
  TestCase32 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(EzRpc, Basic) {
  int callCount = 0;
  EzRpcServer server(kj::heap<TestInterfaceImpl>(callCount), "localhost");

  EzRpcClient client("localhost", server.getPort().wait(server.getWaitScope()));

  auto cap = client.getMain<test::TestInterface>();
  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);

  EXPECT_EQ(0, callCount);
  auto response = request.send().wait(server.getWaitScope());
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(1, callCount);
}